

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

void duckdb::QuantileListOperation<double,true>::
     Finalize<duckdb::list_entry_t,duckdb::QuantileState<double,duckdb::QuantileStandardType>>
               (QuantileState<double,_duckdb::QuantileStandardType> *state,list_entry_t *target,
               AggregateFinalizeData *finalize_data)

{
  _func_int **pp_Var1;
  FunctionData *pFVar2;
  Vector *pVVar3;
  idx_t iVar4;
  reference q_00;
  uint64_t uVar5;
  idx_t n;
  unsigned_long *q;
  _func_int **pp_Var6;
  double dVar7;
  QuantileDirect<double> local_89;
  list_entry_t *local_88;
  AggregateFinalizeData *local_80;
  data_ptr_t local_78;
  pointer local_70;
  vector<duckdb::QuantileValue,_true> *local_68;
  Vector *local_60;
  Interpolator<true> local_58;
  
  if ((state->v).super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (state->v).super_vector<double,_std::allocator<double>_>.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    pFVar2 = optional_ptr<duckdb::FunctionData,_true>::operator->(&finalize_data->input->bind_data);
    pVVar3 = ListVector::GetEntry(finalize_data->result);
    iVar4 = ListVector::GetListSize(finalize_data->result);
    local_68 = (vector<duckdb::QuantileValue,_true> *)(pFVar2 + 1);
    local_80 = finalize_data;
    ListVector::Reserve(finalize_data->result,
                        ((long)pFVar2[2]._vptr_FunctionData - (long)pFVar2[1]._vptr_FunctionData) /
                        0x68 + iVar4);
    local_70 = (state->v).super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
    local_78 = pVVar3->data + iVar4 * 8;
    target->offset = iVar4;
    pp_Var1 = pFVar2[5]._vptr_FunctionData;
    iVar4 = 0;
    local_88 = target;
    local_60 = pVVar3;
    for (pp_Var6 = pFVar2[4]._vptr_FunctionData; pp_Var6 != pp_Var1; pp_Var6 = pp_Var6 + 1) {
      q_00 = vector<duckdb::QuantileValue,_true>::get<true>(local_68,(size_type)*pp_Var6);
      n = (long)(state->v).super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(state->v).super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start >> 3;
      local_58.desc = *(bool *)&pFVar2[7]._vptr_FunctionData;
      local_58.FRN = Interpolator<true>::Index(q_00,n);
      local_58.CRN = local_58.FRN;
      local_58.begin = iVar4;
      local_58.end = n;
      dVar7 = Interpolator<true>::Operation<double,double,duckdb::QuantileDirect<double>>
                        (&local_58,local_70,local_60,&local_89);
      *(double *)(local_78 + (long)*pp_Var6 * 8) = dVar7;
      iVar4 = local_58.FRN;
    }
    uVar5 = ((long)pFVar2[2]._vptr_FunctionData - (long)pFVar2[1]._vptr_FunctionData) / 0x68;
    local_88->length = uVar5;
    ListVector::SetListSize(local_80->result,uVar5 + local_88->offset);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v.data();
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		idx_t lower = 0;
		for (const auto &q : bind_data.order) {
			const auto &quantile = bind_data.quantiles[q];
			Interpolator<DISCRETE> interp(quantile, state.v.size(), bind_data.desc);
			interp.begin = lower;
			rdata[ridx + q] = interp.template Operation<typename STATE::InputType, CHILD_TYPE>(v_t, result);
			lower = interp.FRN;
		}
		entry.length = bind_data.quantiles.size();

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}